

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_3.h
# Opt level: O3

void __thiscall
PlayerMike_3::fillPredict(PlayerMike_3 *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  pointer piVar1;
  pointer pMVar2;
  ulong uVar3;
  long lVar4;
  
  piVar1 = (this->m_predict).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1[0x17] = 0;
  piVar1[0x18] = 0;
  piVar1[0x19] = 0;
  piVar1[0x1a] = 0;
  piVar1[0x14] = 0;
  piVar1[0x15] = 0;
  piVar1[0x16] = 0;
  piVar1[0x17] = 0;
  piVar1[0x10] = 0;
  piVar1[0x11] = 0;
  piVar1[0x12] = 0;
  piVar1[0x13] = 0;
  piVar1[0xc] = 0;
  piVar1[0xd] = 0;
  piVar1[0xe] = 0;
  piVar1[0xf] = 0;
  piVar1[8] = 0;
  piVar1[9] = 0;
  piVar1[10] = 0;
  piVar1[0xb] = 0;
  piVar1[4] = 0;
  piVar1[5] = 0;
  piVar1[6] = 0;
  piVar1[7] = 0;
  piVar1[0] = 0;
  piVar1[1] = 0;
  piVar1[2] = 0;
  piVar1[3] = 0;
  pMVar2 = (moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar2 >> 3;
  if (1 < uVar3) {
    lVar4 = 0;
    do {
      piVar1[(long)pMVar2[lVar4 + 1].m_you +
             (long)pMVar2[lVar4].m_me * 3 + (long)pMVar2[lVar4].m_you * 9] =
           piVar1[(long)pMVar2[lVar4 + 1].m_you +
                  (long)pMVar2[lVar4].m_me * 3 + (long)pMVar2[lVar4].m_you * 9] + 1;
      lVar4 = lVar4 + 1;
    } while (uVar3 - 1 != lVar4);
  }
  return;
}

Assistant:

void fillPredict(const std::vector<Move>& moveHistory)
   {
      for (int ix=0; ix<27; ++ix)
      {
         m_predict[ix] = 0;
      }

      for (size_t i=1; i<moveHistory.size(); ++i)
      {
         int ix = moveHistory[i-1].m_you*9 + moveHistory[i-1].m_me*3 + moveHistory[i].m_you;
         m_predict[ix] += 1;
      }

#ifdef DEBUG
      for (int row=0; row<9; ++row)
      {
         std::cout << m_predict[3*row] << " , " << m_predict[3*row+1] << " , " << m_predict[3*row+2] << std::endl;
      }
#endif
   }